

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

bool __thiscall
andres::
BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>
::overlaps<int,false,std::allocator<unsigned_long>>
          (BinaryViewExpression<andres::View<int,true,std::allocator<unsigned_long>>,int,andres::View<int,true,std::allocator<unsigned_long>>,int,andres::marray_detail::Plus<int,int,int>>
           *this,View<int,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  
  bVar1 = View<int,true,std::allocator<unsigned_long>>::
          overlaps<int,false,std::allocator<unsigned_long>>
                    (*(View<int,true,std::allocator<unsigned_long>> **)this,v);
  if (bVar1) {
    return true;
  }
  bVar1 = View<int,true,std::allocator<unsigned_long>>::
          overlaps<int,false,std::allocator<unsigned_long>>
                    (*(View<int,true,std::allocator<unsigned_long>> **)(this + 8),v);
  return bVar1;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e1_.overlaps(v) || e2_.overlaps(v); }